

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O1

void __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::NNLS
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,MatrixType *A,int max_iter,
          Scalar eps)

{
  MatrixType *this_00;
  MatrixAtAType *this_01;
  ulong uVar1;
  long lVar2;
  ulong cols;
  undefined1 auVar3 [16];
  undefined8 *puVar4;
  char *__function;
  ActualDstType actualDst;
  assign_op<float,_float> local_81;
  MatrixAtAType *local_80;
  RowVectorType *local_78;
  RowVectorType *local_70;
  RowVectorType *local_68;
  MatrixType *local_60;
  Matrix<float,__1,__1,_0,__1,__1> local_58;
  Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>
  local_40;
  
  this->_max_iter = max_iter;
  this->_num_ls = 0;
  this->_epsilon = eps;
  this_00 = &this->_A;
  DenseStorage<float,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<float,__1,__1,__1,_0> *)this_00,(DenseStorage<float,__1,__1,__1,_0> *)A);
  this_01 = &this->_AtA;
  uVar1 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->_AtA).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (float *)0x0;
  (this->_AtA).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->_AtA).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  if ((long)uVar1 < 0) {
LAB_00171369:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
                 );
  }
  local_80 = this_01;
  local_60 = this_00;
  if ((uVar1 != 0) &&
     (auVar3._8_8_ = 0, auVar3._0_8_ = uVar1,
     SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar3,0) < (long)uVar1)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = boost::program_options::detail::cmdline::cmdline;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  DenseStorage<float,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<float,__1,__1,__1,_0> *)this_01,uVar1 * uVar1,uVar1,uVar1);
  lVar2 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)0x0;
  (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if (-1 < lVar2) {
    local_68 = &this->_x;
    DenseStorage<float,_-1,_-1,_1,_0>::resize
              ((DenseStorage<float,__1,__1,_1,_0> *)local_68,lVar2,lVar2,1);
    lVar2 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols;
    (this->_w).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)0x0;
    (this->_w).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    if (-1 < lVar2) {
      local_70 = &this->_w;
      DenseStorage<float,_-1,_-1,_1,_0>::resize
                ((DenseStorage<float,__1,__1,_1,_0> *)local_70,lVar2,lVar2,1);
      lVar2 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (float *)0x0;
      (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if (-1 < lVar2) {
        local_78 = &this->_y;
        DenseStorage<float,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<float,__1,__1,_1,_0> *)local_78,lVar2,lVar2,1);
        (this->_Atb).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
             = (float *)0x0;
        (this->_Atb).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             = 0;
        lVar2 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage
                .m_cols;
        (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
        m_data = (long *)0x0;
        (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows = 0;
        if (lVar2 < 0) {
          __function = 
          "void Eigen::PlainObjectBase<Eigen::Matrix<long, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<long, -1, 1>]"
          ;
          goto LAB_0017135f;
        }
        DenseStorage<long,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<long,__1,__1,_1,_0> *)&this->_P,lVar2,lVar2,1);
        uVar1 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows;
        cols = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols;
        (this->_QR).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (float *)0x0;
        (this->_QR).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = 0;
        (this->_QR).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             = 0;
        if ((long)(cols | uVar1) < 0) goto LAB_00171369;
        if ((cols != 0 && uVar1 != 0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)cols),0) <
            (long)uVar1)) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = boost::program_options::detail::cmdline::cmdline;
          __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        DenseStorage<float,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<float,__1,__1,__1,_0> *)&this->_QR,cols * uVar1,uVar1,cols);
        lVar2 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage
                .m_cols;
        (this->_qrCoeffs).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
        m_data = (float *)0x0;
        (this->_qrCoeffs).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows = 0;
        if (-1 < lVar2) {
          DenseStorage<float,_-1,_-1,_1,_0>::resize
                    ((DenseStorage<float,__1,__1,_1,_0> *)&this->_qrCoeffs,lVar2,lVar2,1);
          lVar2 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols;
          (this->_tempVector).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
          m_storage.m_data = (float *)0x0;
          (this->_tempVector).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows = 0;
          if (-1 < lVar2) {
            DenseStorage<float,_-1,_-1,_1,_0>::resize
                      ((DenseStorage<float,__1,__1,_1,_0> *)&this->_tempVector,lVar2,lVar2,1);
            local_40.m_lhs.m_matrix = A;
            local_40.m_rhs = A;
            Matrix<float,-1,-1,0,-1,-1>::
            Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
                      ((Matrix<float,_1,_1,0,_1,_1> *)&local_58,&local_40);
            internal::
            call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::internal::assign_op<float,float>>
                      (local_80,&local_58,&local_81);
            free(local_58.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data);
            return;
          }
        }
      }
    }
  }
  __function = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<float, -1, 1>]"
  ;
LAB_0017135f:
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x130,__function);
}

Assistant:

NNLS(const MatrixType &A, int max_iter=-1, Scalar eps=1e-10)
    : _max_iter(max_iter), _num_ls(0), _epsilon(eps),
      _A(A), _AtA(_A.cols(), _A.cols()),
      _x(_A.cols()), _w(_A.cols()), _y(_A.cols()),
      _P(_A.cols()), _QR(_A.rows(), _A.cols()), _qrCoeffs(_A.cols()), _tempVector(_A.cols())
  {
    // Ensure Scalar type is real.
    EIGEN_STATIC_ASSERT(!NumTraits<Scalar>::IsComplex, NUMERIC_TYPE_MUST_BE_REAL);

    // Precompute A^T*A
    _AtA = A.transpose() * A;
  }